

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall
iutest::detail::ParamTestSuiteInfo<RenameParamTest>::OnRegisterTests
          (ParamTestSuiteInfo<RenameParamTest> *this,IParamTestInfoData *infodata)

{
  pfnParamNameGeneratorFunc p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pointer ppVar5;
  ParamGenerator *p_00;
  TypeId pvVar6;
  SetUpTearDownTestSuiteFuncType p_Var7;
  SetUpTearDownTestSuiteFuncType p_Var8;
  undefined4 extraout_var;
  iuIParamGenerator<bool> *piVar9;
  char *pcVar10;
  iu_stringstream *piVar11;
  ostream *poVar12;
  long *plVar13;
  string local_2e8 [32];
  long *local_2c8;
  EachTest *test;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string name;
  size_t i;
  TestSuite *testsuite;
  int line;
  char *file;
  undefined1 local_50 [8];
  string testsuite_name;
  scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  const_iterator gen_end;
  const_iterator gen_it;
  IParamTestInfoData *infodata_local;
  ParamTestSuiteInfo<RenameParamTest> *this_local;
  undefined4 extraout_var_00;
  
  gen_end = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
            ::begin(&this->m_instantiation);
  p.m_ptr = (iuIParamGenerator<bool> *)
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
            ::end(&this->m_instantiation);
  while (bVar2 = __gnu_cxx::operator!=
                           (&gen_end,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
                                      *)&p), bVar2) {
    ppVar5 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
             ::operator->(&gen_end);
    p_00 = (*(ppVar5->second).CreateGen)();
    scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::scoped_ptr((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&testsuite_name.field_2 + 8),p_00);
    ppVar5 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
             ::operator->(&gen_end);
    CreateTestSuiteName((string *)local_50,this,&ppVar5->first);
    ppVar5 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
             ::operator->(&gen_end);
    pcVar10 = (ppVar5->second).m_file;
    ppVar5 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
             ::operator->(&gen_end);
    iVar3 = (ppVar5->second).m_line;
    pvVar6 = internal::GetTypeId<RenameParamTest>();
    p_Var7 = legacy::SuiteApiResolver<RenameParamTest>::GetSetUpCaseOrSuite(pcVar10,iVar3);
    p_Var8 = legacy::SuiteApiResolver<RenameParamTest>::GetTearDownCaseOrSuite(pcVar10,iVar3);
    iVar3 = (*infodata->_vptr_IParamTestInfoData[2])(infodata,local_50,pvVar6,p_Var7,p_Var8);
    piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::get((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&testsuite_name.field_2 + 8));
    if (piVar9 != (iuIParamGenerator<bool> *)0x0) {
      name.field_2._8_8_ = 0;
      piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&testsuite_name.field_2 + 8));
      (*piVar9->_vptr_iuIParamGenerator[2])();
      while( true ) {
        piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&testsuite_name.field_2 + 8));
        iVar4 = (*piVar9->_vptr_iuIParamGenerator[5])();
        if ((((byte)iVar4 ^ 0xff) & 1) == 0) break;
        pcVar10 = IParamTestInfoData::GetName(infodata);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar10,&local_c1);
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
                 ::operator->(&gen_end);
        p_Var1 = (ppVar5->second).ParamNameGen;
        piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&testsuite_name.field_2 + 8));
        (*piVar9->_vptr_iuIParamGenerator[3])(&local_130);
        TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::TestParamInfo(&local_110,&local_130,name.field_2._8_8_);
        (*p_Var1)(&local_e8,&local_110);
        MakeParamTestName((string *)local_a0,&local_c0,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~TestParamInfo(&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        bVar2 = CheckTestName((TestSuite *)CONCAT44(extraout_var,iVar3),(string *)local_a0);
        if (!bVar2) {
          IUTestLog::IUTestLog
                    ((IUTestLog *)&test,LOG_WARNING,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_params_util.hpp"
                     ,0xcb);
          piVar11 = IUTestLog::GetStream_abi_cxx11_((IUTestLog *)&test);
          poVar12 = std::operator<<((ostream *)&piVar11->field_0x10,(string *)local_50);
          poVar12 = std::operator<<(poVar12,".");
          poVar12 = std::operator<<(poVar12,(string *)local_a0);
          std::operator<<(poVar12," is already exist.");
          IUTestLog::~IUTestLog((IUTestLog *)&test);
        }
        iVar4 = (*infodata->_vptr_IParamTestInfoData[3])
                          (infodata,(TestSuite *)CONCAT44(extraout_var,iVar3),local_a0);
        plVar13 = (long *)CONCAT44(extraout_var_00,iVar4);
        local_2c8 = plVar13;
        piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&testsuite_name.field_2 + 8));
        (*piVar9->_vptr_iuIParamGenerator[3])(local_2e8);
        (**(code **)(*plVar13 + 0x10))(plVar13,local_2e8);
        std::__cxx11::string::~string(local_2e8);
        name.field_2._8_8_ = name.field_2._8_8_ + 1;
        std::__cxx11::string::~string((string *)local_a0);
        piVar9 = scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&testsuite_name.field_2 + 8));
        (*piVar9->_vptr_iuIParamGenerator[4])();
      }
    }
    std::__cxx11::string::~string((string *)local_50);
    scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~scoped_ptr((scoped_ptr<iutest::detail::iuIParamGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&testsuite_name.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>_>
    ::operator++(&gen_end);
  }
  return;
}

Assistant:

virtual void OnRegisterTests(IParamTestInfoData* infodata) const IUTEST_CXX_OVERRIDE
    {
        for( typename InstantiationContainer::const_iterator gen_it=m_instantiation.begin()
            , gen_end=m_instantiation.end(); gen_it != gen_end; ++gen_it )
        {
            // パラメータ生成器の作成
            detail::scoped_ptr<ParamGenerator> p((gen_it->second.CreateGen)());

            const ::std::string testsuite_name = CreateTestSuiteName(gen_it->first);
            const char* file = gen_it->second.m_file;
            const int line = gen_it->second.m_line;
            TestSuite* testsuite = infodata->MakeTestSuite(testsuite_name
                , internal::GetTypeId<Tester>()
                , IUTEST_GET_SETUP_TESTSUITE(Tester, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(Tester, file, line));

            if( p.get() != NULL )
            {
                size_t i=0;
                for( p->Begin(); !p->IsEnd(); p->Next() )
                {
                    const ::std::string name = MakeParamTestName(infodata->GetName()
                        , gen_it->second.ParamNameGen(TestParamInfo<ParamType>(p->GetCurrent(), i)) );
#if IUTEST_CHECK_STRICT
                    if( !CheckTestName(testsuite, name) )
                    {
                        IUTEST_LOG_(WARNING) << testsuite_name << "." << name << " is already exist.";
                    }
#endif
                    EachTest* test = static_cast<EachTest*>(infodata->RegisterTest(testsuite, name));
                    test->SetParam(p->GetCurrent());
                    ++i;
                }
            }
        }
    }